

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::PointerBuilder::getList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  CapTableBuilder *capTable;
  word *pwVar5;
  ElementSize EVar6;
  uint uVar7;
  WirePointer *pWVar8;
  SegmentBuilder *this_00;
  uint uVar9;
  ulong uVar10;
  WirePointer *pWVar11;
  Fault f;
  Fault local_48;
  SegmentBuilder *local_40;
  WirePointer *local_38;
  
  uVar9 = (uint)elementSize;
  local_38 = this->pointer;
  local_40 = this->segment;
  capTable = this->capTable;
  uVar7 = (local_38->offsetAndKind).value;
  if ((local_38->field_1).upper32Bits == 0 && uVar7 == 0) goto LAB_001c160a;
  pWVar8 = local_38 + (long)((int)uVar7 >> 2) + 1;
  do {
    pWVar11 = local_38;
    this_00 = local_40;
    if ((uVar7 & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(local_40->super_SegmentReader).arena,
                           (SegmentId)(local_38->field_1).structRef);
      uVar7 = (pWVar11->offsetAndKind).value;
      pwVar5 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar7 & 0xfffffff8);
      pWVar1 = (WirePointer *)((long)&pwVar5->content + uVar10);
      pWVar11 = (WirePointer *)((long)&pwVar5[1].content + uVar10);
      if ((uVar7 & 4) == 0) {
        pWVar8 = pWVar11 + ((int)(pWVar1->offsetAndKind).value >> 2);
        pWVar11 = pWVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar1->field_1).structRef);
        pWVar8 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar1->offsetAndKind).value & 0xfffffff8));
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((pWVar11->offsetAndKind).value & 3) == 1) {
      uVar7 = (pWVar11->field_1).upper32Bits;
      EVar6 = (ElementSize)uVar7 & INLINE_COMPOSITE;
      if (EVar6 == INLINE_COMPOSITE) {
        uVar7 = (uint)*(uint64_t *)&(pWVar8->offsetAndKind).value;
        if ((uVar7 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x502,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&local_48);
        }
        pWVar11 = pWVar8 + 1;
        uVar2 = *(ushort *)&pWVar8->field_1;
        uVar3 = (pWVar8->field_1).structRef.ptrCount.value;
        if (uVar9 - 2 < 4) {
          if ((ulong)uVar2 != 0) goto LAB_001c1715;
          getList();
        }
        else if (uVar9 == 1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    (&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x510,FAILED,(char *)0x0,
                     "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])
                      "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault(&local_48);
        }
        else {
          if (uVar9 != 6) {
            if (uVar9 == 7) {
              kj::_::unreachable();
            }
LAB_001c1715:
            __return_storage_ptr__->segment = this_00;
            __return_storage_ptr__->capTable = capTable;
            __return_storage_ptr__->ptr = (byte *)pWVar11;
            __return_storage_ptr__->elementCount = uVar7 >> 2 & 0x1fffffff;
            __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
            __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
            __return_storage_ptr__->structPointerCount = uVar3;
            __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
            return __return_storage_ptr__;
          }
          if (uVar3 != 0) {
            pWVar11 = pWVar11 + uVar2;
            goto LAB_001c1715;
          }
          getList();
        }
      }
      else {
        uVar4 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar6 * 4);
        if (elementSize == BIT) {
          if (EVar6 == BIT) {
LAB_001c178f:
            __return_storage_ptr__->segment = this_00;
            __return_storage_ptr__->capTable = capTable;
            __return_storage_ptr__->ptr = (byte *)pWVar8;
            __return_storage_ptr__->elementCount = uVar7 >> 3;
            __return_storage_ptr__->step = (uint)(EVar6 == POINTER) * 0x40 + uVar4;
            __return_storage_ptr__->structDataSize = uVar4;
            __return_storage_ptr__->structPointerCount = (ushort)(EVar6 == POINTER);
            __return_storage_ptr__->elementSize = EVar6;
            return __return_storage_ptr__;
          }
          getList();
        }
        else if (EVar6 == BIT) {
          getList();
        }
        else if (uVar4 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)uVar9 * 4)) {
          getList();
        }
        else {
          if ((elementSize != POINTER) || (EVar6 == POINTER)) goto LAB_001c178f;
          getList();
        }
      }
    }
    else {
      getList();
    }
LAB_001c160a:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
      __return_storage_ptr__->elementSize = elementSize;
      return __return_storage_ptr__;
    }
    pWVar8 = (WirePointer *)
             WireHelpers::copyMessage(&local_40,capTable,&local_38,(WirePointer *)defaultValue);
    uVar7 = (local_38->offsetAndKind).value;
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getList(ElementSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableListPointer(pointer, segment, capTable, elementSize, defaultValue);
}